

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall antlr::ASTFactory::addASTChild(ASTFactory *this,ASTPair *currentAST,RefAST *child)

{
  AST *pAVar1;
  ASTRefCount *in_RDX;
  ASTRefCount *in_RSI;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffffa8;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffffb0;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount *this_01;
  undefined1 local_38 [24];
  ASTRefCount<antlr::AST> in_stack_ffffffffffffffe0;
  
  this_01 = in_RDX;
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 != (AST *)0x0) {
    pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RSI);
    if (pAVar1 == (AST *)0x0) {
      ASTRefCount<antlr::AST>::operator=
                ((ASTRefCount<antlr::AST> *)this_01,(ASTRefCount<antlr::AST> *)in_RDX);
    }
    else {
      pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RSI + 8);
      if (pAVar1 == (AST *)0x0) {
        pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
        this_00 = (ASTRefCount<antlr::AST> *)&stack0xffffffffffffffe0;
        ASTRefCount<antlr::AST>::ASTRefCount(this_00,(ASTRefCount<antlr::AST> *)pAVar1);
        (*pAVar1->_vptr_AST[0x14])(pAVar1,this_00);
        ASTRefCount<antlr::AST>::~ASTRefCount(this_00);
      }
      else {
        pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)(in_RSI + 8));
        ASTRefCount<antlr::AST>::ASTRefCount(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        (*pAVar1->_vptr_AST[0x15])(pAVar1,local_38);
        ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffffb0);
      }
    }
    ASTRefCount<antlr::AST>::operator=
              ((ASTRefCount<antlr::AST> *)this_01,(ASTRefCount<antlr::AST> *)in_RDX);
    ASTPair::advanceChildToEnd((ASTPair *)in_stack_ffffffffffffffe0.ref);
  }
  return;
}

Assistant:

void ASTFactory::addASTChild(ASTPair& currentAST, RefAST child)
{
	if (child)
	{
		if (!currentAST.root)
		{
			// Make new child the current root
			currentAST.root = child;
		}
		else
		{
			if (!currentAST.child)
			{
				// Add new child to current root
				currentAST.root->setFirstChild(child);
			}
			else
			{
				currentAST.child->setNextSibling(child);
			}
		}
		// Make new child the current child
		currentAST.child = child;
		currentAST.advanceChildToEnd();
	}
}